

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_posix.hpp
# Opt level: O3

void __thiscall
chaiscript::detail::Loadable_Module::DLModule::DLModule(DLModule *this,string *t_filename)

{
  void *pvVar1;
  runtime_error *this_00;
  char *__s;
  allocator<char> local_39;
  string local_38 [32];
  
  pvVar1 = (void *)dlopen((t_filename->_M_dataplus)._M_p,2);
  this->m_data = pvVar1;
  if (pvVar1 != (void *)0x0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  __s = (char *)dlerror();
  std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
  std::runtime_error::runtime_error(this_00,local_38);
  *(undefined ***)this_00 = &PTR__runtime_error_003d2788;
  __cxa_throw(this_00,&chaiscript::exception::load_module_error::typeinfo,
              std::runtime_error::~runtime_error);
}

Assistant:

explicit DLModule(const std::string &t_filename)
          : m_data(dlopen(t_filename.c_str(), RTLD_NOW)) {
        if (m_data == nullptr) {
          throw chaiscript::exception::load_module_error(dlerror());
        }
      }